

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TMap<int,_FPlayerColorSet,_THashTraits<int>,_TValueTraits<FPlayerColorSet>_>::CopyNodes
          (TMap<int,_FPlayerColorSet,_THashTraits<int>,_TValueTraits<FPlayerColorSet>_> *this,
          Node *nodes,hash_t numnodes)

{
  bool bVar1;
  Node *pNVar2;
  Node *n;
  Node *pNStack_18;
  hash_t numnodes_local;
  Node *nodes_local;
  TMap<int,_FPlayerColorSet,_THashTraits<int>,_TValueTraits<FPlayerColorSet>_> *this_local;
  
  n._4_4_ = numnodes;
  pNStack_18 = nodes;
  while (n._4_4_ != 0) {
    bVar1 = Node::IsNil(pNStack_18);
    if (!bVar1) {
      pNVar2 = NewKey(this,(pNStack_18->Pair).Key);
      FPlayerColorSet::FPlayerColorSet(&(pNVar2->Pair).Value,&(pNStack_18->Pair).Value);
    }
    pNStack_18 = pNStack_18 + 1;
    n._4_4_ = n._4_4_ - 1;
  }
  return;
}

Assistant:

void CopyNodes(const Node *nodes, hash_t numnodes)
	{
		for (; numnodes-- > 0; ++nodes)
		{
			if (!nodes->IsNil())
			{
				Node *n = NewKey(nodes->Pair.Key);
				::new(&n->Pair.Value) VT(nodes->Pair.Value);
			}
		}
	}